

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibAPI.h
# Opt level: O0

bool __thiscall
luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT>
          (StackAPI *this,int minCount,ValueT types,ValueT types_1)

{
  int params_00;
  int in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  int params;
  ValueT type;
  undefined4 in_stack_ffffffffffffffe0;
  undefined1 local_1;
  
  params_00 = GetStackSize((StackAPI *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  type = (ValueT)((ulong)in_RDI >> 0x20);
  if (params_00 < in_ESI) {
    ArgCountError((StackAPI *)CONCAT44(in_ECX,params_00),type);
    local_1 = false;
  }
  else {
    local_1 = CheckArgs<luna::ValueT>
                        ((StackAPI *)CONCAT44(in_ESI,in_EDX),in_ECX,params_00,type,(ValueT)in_RDI);
  }
  return local_1;
}

Assistant:

bool CheckArgs(int minCount, ValueTypes... types)
        {
            // Check count of arguments
            auto params = GetStackSize();
            if (params < minCount)
            {
                ArgCountError(minCount);
                return false;
            }

            return CheckArgs(0, params, types...);
        }